

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrContains
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber)

{
  bool bVar1;
  TestResult *pTVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  SimpleString *in_R8;
  UtestShell *in_stack_fffffffffffffe38;
  SimpleString *in_stack_fffffffffffffe40;
  SimpleString *in_stack_fffffffffffffe78;
  SimpleString *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  UtestShell *in_stack_fffffffffffffe98;
  ContainsFailure *in_stack_fffffffffffffea0;
  SimpleString *in_stack_fffffffffffffeb0;
  UtestShell local_d8;
  undefined1 local_98 [112];
  SimpleString *local_28;
  long local_18;
  long local_10;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = getTestResult(in_stack_fffffffffffffe38);
  (*pTVar2->_vptr_TestResult[10])();
  if ((local_18 != 0) || (local_10 != 0)) {
    if ((local_18 == 0) || (local_10 == 0)) {
      SimpleString::SimpleString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      SimpleString::SimpleString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      SimpleString::SimpleString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe38 = &local_d8;
      ContainsFailure::ContainsFailure
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffeb0);
      (**(code **)(*in_RDI + 0x130))(in_RDI,local_98);
      ContainsFailure::~ContainsFailure((ContainsFailure *)0x11f268);
      SimpleString::~SimpleString((SimpleString *)0x11f275);
      SimpleString::~SimpleString((SimpleString *)0x11f282);
      SimpleString::~SimpleString((SimpleString *)0x11f28f);
    }
    SimpleString::SimpleString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    SimpleString::SimpleString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    bVar1 = SimpleString::contains
                      (in_stack_fffffffffffffe40,(SimpleString *)in_stack_fffffffffffffe38);
    SimpleString::~SimpleString((SimpleString *)0x11f381);
    SimpleString::~SimpleString((SimpleString *)0x11f38e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      SimpleString::SimpleString(local_28,(char *)in_stack_fffffffffffffe38);
      SimpleString::SimpleString(local_28,(char *)in_stack_fffffffffffffe38);
      SimpleString::SimpleString(local_28,(char *)in_stack_fffffffffffffe38);
      ContainsFailure::ContainsFailure
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffeb0);
      (**(code **)(*in_RDI + 0x130))(in_RDI,&stack0xfffffffffffffea0);
      ContainsFailure::~ContainsFailure((ContainsFailure *)0x11f441);
      SimpleString::~SimpleString((SimpleString *)0x11f44b);
      SimpleString::~SimpleString((SimpleString *)0x11f455);
      SimpleString::~SimpleString((SimpleString *)0x11f45f);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrContains(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
    if (!SimpleString(actual).contains(expected))
        failWith(ContainsFailure(this, fileName, lineNumber, expected, actual, text));
}